

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniformui_incompatible_type
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint64 dVar2;
  deUint32 dVar3;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *this_00;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  MessageBuilder local_3a0;
  int local_21c;
  GLint local_218;
  GLint sampler_f;
  GLint uvec4_f;
  GLint ivec4_f;
  GLint vec4_v;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vec4_v,puVar1,(allocator<char> *)((long)&ivec4_f + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,(string *)&vec4_v);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&vec4_v);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ivec4_f + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  uvec4_f = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar2,dVar3,"vec4_v");
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  sampler_f = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar2,dVar3,"ivec4_f");
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_218 = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar2,dVar3,"uvec4_f");
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_21c = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar2,dVar3,"sampler_f");
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  if ((((uvec4_f == -1) || (sampler_f == -1)) || (local_218 == -1)) || (local_21c == -1)) {
    this = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
    tcu::TestLog::operator<<(&local_3a0,this,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_3a0,(char (*) [46])"// ERROR: Failed to retrieve uniform location");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3a0);
    dVar2 = program.m_program.m_info.linkTimeUs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"Failed to retrieve uniform location",&local_3c1);
    NegativeTestContext::fail((NegativeTestContext *)dVar2,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
  }
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,
             "GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command."
             ,&local_3e9);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  glu::CallLogWrapper::glUniform1ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_218,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform2ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_218,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform3ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_218,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform4ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_218,0,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,
             "GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type int, ivec2, ivec3, ivec4, or an array of these."
             ,&local_411);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  glu::CallLogWrapper::glUniform1ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,sampler_f,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform2ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,sampler_f,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform3ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,sampler_f,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform4ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,sampler_f,0,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,
             "GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type float, vec2, vec3, or vec4."
             ,&local_439);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  glu::CallLogWrapper::glUniform1ui((CallLogWrapper *)program.m_program.m_info.linkTimeUs,uvec4_f,0)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform2ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,uvec4_f,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform3ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,uvec4_f,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  glu::CallLogWrapper::glUniform4ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,uvec4_f,0,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,
             "GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv."
             ,&local_461);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  glu::CallLogWrapper::glUniform1ui
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_21c,0);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void uniformui_incompatible_type (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	GLint vec4_v	= ctx.glGetUniformLocation(program.getProgram(), "vec4_v");	// vec4
	GLint ivec4_f	= ctx.glGetUniformLocation(program.getProgram(), "ivec4_f");	// ivec4
	GLint uvec4_f	= ctx.glGetUniformLocation(program.getProgram(), "uvec4_f");	// uvec4
	GLint sampler_f	= ctx.glGetUniformLocation(program.getProgram(), "sampler_f");	// sampler2D
	ctx.expectError(GL_NO_ERROR);

	if (vec4_v == -1 || ivec4_f == -1 || uvec4_f == -1 || sampler_f == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	ctx.beginSection("GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(uvec4_f, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2ui(uvec4_f, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3ui(uvec4_f, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4ui(uvec4_f, 0, 0, 0, 0);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type int, ivec2, ivec3, ivec4, or an array of these.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(ivec4_f, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2ui(ivec4_f, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3ui(ivec4_f, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4ui(ivec4_f, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glUniform{1234}i is used to load a uniform variable of type float, vec2, vec3, or vec4.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(vec4_v, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2ui(vec4_v, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3ui(vec4_v, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4ui(vec4_v, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1ui(sampler_f, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}